

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  bool bVar1;
  Code _colourCode;
  size_t count;
  ostream *poVar2;
  pointer pMVar3;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  *__lhs;
  Colour local_aa;
  allocator<char> local_a9;
  undefined1 local_a8 [6];
  Colour colourGuard_1;
  pluralise local_88;
  Colour local_49;
  MessageInfo *pMStack_48;
  Colour colourGuard;
  size_t N;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_28;
  const_iterator itEnd;
  Code colour_local;
  AssertionPrinter *this_local;
  
  itEnd._M_current =
       (MessageInfo *)
       std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end(&this->messages);
  bVar1 = __gnu_cxx::operator==
                    (&this->itMessage,
                     (__normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)&itEnd);
  if (!bVar1) {
    N = (size_t)std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                          (&this->messages);
    __gnu_cxx::
    __normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>
    ::__normal_iterator<Catch::MessageInfo*>
              ((__normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>
                *)&local_28,
               (__normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                *)&N);
    pMStack_48 = local_28._M_current;
    count = std::
            distance<__gnu_cxx::__normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>>
                      ((this->itMessage)._M_current,local_28);
    Colour::Colour(&local_49,colour);
    poVar2 = std::operator<<(this->stream," with ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"message",&local_a9);
    pluralise::pluralise(&local_88,count,(string *)local_a8);
    poVar2 = Catch::operator<<(poVar2,&local_88);
    std::operator<<(poVar2,":");
    pluralise::~pluralise(&local_88);
    std::__cxx11::string::~string((string *)local_a8);
    std::allocator<char>::~allocator(&local_a9);
    Colour::~Colour(&local_49);
    while (bVar1 = __gnu_cxx::operator!=(&this->itMessage,&local_28), bVar1) {
      if (((this->printInfoMessages & 1U) != 0) ||
         (pMVar3 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator->(&this->itMessage), pMVar3->type != Info)) {
        poVar2 = std::operator<<(this->stream," \'");
        pMVar3 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&this->itMessage);
        poVar2 = std::operator<<(poVar2,(string *)&pMVar3->message);
        std::operator<<(poVar2,"\'");
        __lhs = __gnu_cxx::
                __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                ::operator++(&this->itMessage);
        bVar1 = __gnu_cxx::operator!=(__lhs,&local_28);
        if (bVar1) {
          _colourCode = dimColour();
          Colour::Colour(&local_aa,_colourCode);
          std::operator<<(this->stream," and");
          Colour::~Colour(&local_aa);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages( Colour::Code colour = dimColour() ) {
                if ( itMessage == messages.end() )
                    return;

                // using messages.end() directly yields compilation error:
                std::vector<MessageInfo>::const_iterator itEnd = messages.end();
                const std::size_t N = static_cast<std::size_t>( std::distance( itMessage, itEnd ) );

                {
                    Colour colourGuard( colour );
                    stream << " with " << pluralise( N, "message" ) << ":";
                }

                for(; itMessage != itEnd; ) {
                    // If this assertion is a warning ignore any INFO messages
                    if( printInfoMessages || itMessage->type != ResultWas::Info ) {
                        stream << " '" << itMessage->message << "'";
                        if ( ++itMessage != itEnd ) {
                            Colour colourGuard( dimColour() );
                            stream << " and";
                        }
                    }
                }
            }